

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> * __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::operator=
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          Matrix<double,__1,_1,_0,__1,_1> *t)

{
  double *pdVar1;
  double *pdVar2;
  DenseStorage<double,__1,__1,_1,_0> *pDVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  Index size;
  Index index;
  ulong uVar8;
  long lVar9;
  ActualDstType actualDst;
  
  if (((this->keepReference == true) && (this->signalType == REFERENCE_NON_CONST)) &&
     (this->TreferenceNonConst != (Matrix<double,__1,_1,_0,__1,_1> *)0x0)) {
    if (this->providerMutex == (Mutex *)0x0) {
      setTcopy(this,t);
      pDVar3 = (DenseStorage<double,__1,__1,_1,_0> *)this->TreferenceNonConst;
      pdVar4 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar8 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (pDVar3->m_rows != uVar8) {
        if ((long)uVar8 < 0) goto LAB_00126e00;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(pDVar3,uVar8,uVar8,1);
      }
      uVar5 = pDVar3->m_rows;
      if (uVar5 != uVar8) goto LAB_00126de1;
      pdVar6 = pDVar3->m_data;
      uVar8 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar5) {
        lVar9 = 0;
        do {
          pdVar1 = pdVar4 + lVar9;
          dVar7 = pdVar1[1];
          pdVar2 = pdVar6 + lVar9;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar7;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar5) {
        do {
          pdVar6[uVar8] = pdVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
    else {
      setTcopy(this,t);
      pDVar3 = (DenseStorage<double,__1,__1,_1,_0> *)this->TreferenceNonConst;
      pdVar4 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar8 = (t->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if (pDVar3->m_rows != uVar8) {
        if ((long)uVar8 < 0) {
LAB_00126e00:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(pDVar3,uVar8,uVar8,1);
      }
      uVar5 = pDVar3->m_rows;
      if (uVar5 != uVar8) {
LAB_00126de1:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
      pdVar6 = pDVar3->m_data;
      uVar8 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar5) {
        lVar9 = 0;
        do {
          pdVar1 = pdVar4 + lVar9;
          dVar7 = pdVar1[1];
          pdVar2 = pdVar6 + lVar9;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar7;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar5) {
        do {
          pdVar6[uVar8] = pdVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
  }
  else {
    (*(this->super_SignalBase<int>)._vptr_SignalBase[0x18])(this,t);
  }
  return this;
}

Assistant:

Signal<T, Time> &Signal<T, Time>::operator=(const T &t) {
  if (keepReference && (REFERENCE_NON_CONST == signalType) &&
      (NULL != TreferenceNonConst)) {
    if (NULL == providerMutex) {
      setTcopy(t);
      (*TreferenceNonConst) = t;
    } else {
      try {
#ifdef HAVE_LIBBOOST_THREAD
        boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
        setTcopy(t);
        (*TreferenceNonConst) = t;
      } catch (const MutexError &) { /* TODO ERROR */
      }
    }
  } else {
    setConstant(t);
  }
  return *this;
}